

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_set_operation.cpp
# Opt level: O2

void __thiscall
duckdb::StatisticsPropagator::AddCardinalities
          (StatisticsPropagator *this,
          unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
          *stats,NodeStatistics *new_stats)

{
  idx_t iVar1;
  bool bVar2;
  pointer pNVar3;
  long lVar4;
  InternalException *this_00;
  allocator local_79;
  int64_t result;
  string local_70;
  hugeint_t new_max;
  hugeint_t local_40;
  hugeint_t local_30;
  
  pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
           operator->(stats);
  if ((((pNVar3->has_estimated_cardinality == true) &&
       (new_stats->has_estimated_cardinality == true)) &&
      (pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                ::operator->(stats), pNVar3->has_max_cardinality == true)) &&
     (new_stats->has_max_cardinality != false)) {
    iVar1 = new_stats->estimated_cardinality;
    pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
             operator->(stats);
    pNVar3->estimated_cardinality = pNVar3->estimated_cardinality + iVar1;
    pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
             operator->(stats);
    lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pNVar3->max_cardinality);
    hugeint_t::hugeint_t(&local_30,lVar4);
    lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(new_stats->max_cardinality);
    hugeint_t::hugeint_t(&local_40,lVar4);
    new_max = Hugeint::Add<true>(local_30,local_40);
    hugeint_t::hugeint_t((hugeint_t *)&local_70,0x7fffffffffffffff);
    bVar2 = hugeint_t::operator<(&new_max,(hugeint_t *)&local_70);
    if (bVar2) {
      bVar2 = Hugeint::TryCast<long>(new_max,&result);
      if (bVar2) {
        pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                 ::operator->(stats);
        pNVar3->max_cardinality = result;
        return;
      }
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_70,"Overflow in cast in statistics propagation",&local_79);
      InternalException::InternalException(this_00,&local_70);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  local_70._M_dataplus._M_p = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
        stats,(pointer)0x0);
  ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
              &local_70);
  return;
}

Assistant:

void StatisticsPropagator::AddCardinalities(unique_ptr<NodeStatistics> &stats, NodeStatistics &new_stats) {
	if (!stats->has_estimated_cardinality || !new_stats.has_estimated_cardinality || !stats->has_max_cardinality ||
	    !new_stats.has_max_cardinality) {
		stats = nullptr;
		return;
	}
	stats->estimated_cardinality += new_stats.estimated_cardinality;
	auto new_max =
	    Hugeint::Add(NumericCast<int64_t>(stats->max_cardinality), NumericCast<int64_t>(new_stats.max_cardinality));
	if (new_max < NumericLimits<int64_t>::Maximum()) {
		int64_t result;
		if (!Hugeint::TryCast<int64_t>(new_max, result)) {
			throw InternalException("Overflow in cast in statistics propagation");
		}
		D_ASSERT(result >= 0);
		stats->max_cardinality = idx_t(result);
	} else {
		stats = nullptr;
	}
}